

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufDumpNotationDecl(xmlOutputBufferPtr buf,xmlNotationPtr nota)

{
  xmlNotationPtr nota_local;
  xmlOutputBufferPtr buf_local;
  
  xmlOutputBufferWrite(buf,0xb,"<!NOTATION ");
  xmlOutputBufferWriteString(buf,(char *)nota->name);
  if (nota->PublicID == (xmlChar *)0x0) {
    xmlOutputBufferWrite(buf,8," SYSTEM ");
    xmlOutputBufferWriteQuotedString(buf,nota->SystemID);
  }
  else {
    xmlOutputBufferWrite(buf,8," PUBLIC ");
    xmlOutputBufferWriteQuotedString(buf,nota->PublicID);
    if (nota->SystemID != (xmlChar *)0x0) {
      xmlOutputBufferWrite(buf,1," ");
      xmlOutputBufferWriteQuotedString(buf,nota->SystemID);
    }
  }
  xmlOutputBufferWrite(buf,3," >\n");
  return;
}

Assistant:

static void
xmlBufDumpNotationDecl(xmlOutputBufferPtr buf, xmlNotationPtr nota) {
    xmlOutputBufferWrite(buf, 11, "<!NOTATION ");
    xmlOutputBufferWriteString(buf, (const char *) nota->name);

    if (nota->PublicID != NULL) {
	xmlOutputBufferWrite(buf, 8, " PUBLIC ");
	xmlOutputBufferWriteQuotedString(buf, nota->PublicID);
	if (nota->SystemID != NULL) {
	    xmlOutputBufferWrite(buf, 1, " ");
	    xmlOutputBufferWriteQuotedString(buf, nota->SystemID);
	}
    } else {
	xmlOutputBufferWrite(buf, 8, " SYSTEM ");
	xmlOutputBufferWriteQuotedString(buf, nota->SystemID);
    }

    xmlOutputBufferWrite(buf, 3, " >\n");
}